

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd_filter.cc
# Opt level: O1

int __thiscall
sptk::reaper::FdFilter::FilterStream(FdFilter *this,FILE *input_stream,FILE *output_stream)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  int16_t *piVar5;
  int16_t *piVar6;
  uint uVar7;
  ulong uVar8;
  int towrite;
  int local_6c;
  ulong local_68;
  int local_5c;
  FdFilter *local_58;
  ulong local_50;
  FILE *local_48;
  size_t local_40;
  FILE *local_38;
  
  local_40 = (size_t)this->max_input_;
  this->filter_state_ = 1;
  local_38 = (FILE *)output_stream;
  local_68 = fread(this->input_buffer_,2,local_40,(FILE *)input_stream);
  if ((int)local_68 == 0) {
    local_6c = 1;
  }
  else {
    local_6c = 1;
    local_58 = this;
    local_48 = (FILE *)input_stream;
    do {
      iVar2 = getc((FILE *)input_stream);
      iVar3 = feof((FILE *)input_stream);
      if (iVar3 == 0) {
        ungetc(iVar2,(FILE *)input_stream);
      }
      else {
        *(byte *)&this->filter_state_ = (byte)this->filter_state_ | 2;
      }
      uVar1 = this->insert_;
      local_50 = (ulong)uVar1;
      iVar2 = (int)local_68;
      if (1 < (int)uVar1) {
        piVar6 = local_58->input_buffer_ + (int)(uVar1 * iVar2);
        piVar5 = local_58->input_buffer_ + iVar2;
        uVar8 = local_68 & 0xffffffff;
        do {
          piVar5 = piVar5 + -1;
          if (uVar1 - 1 == 0) {
            piVar6 = piVar6 + -1;
          }
          else {
            memset(piVar6 + (-1 - (ulong)(uVar1 - 2)),0,(ulong)(uVar1 - 1) * 2);
            piVar6 = piVar6 + (-2 - (ulong)(uVar1 - 2));
          }
          uVar7 = (int)uVar8 - 1;
          uVar8 = (ulong)uVar7;
          *piVar6 = *piVar5;
        } while (uVar7 != 0);
      }
      this = local_58;
      FilterBuffer(local_58,(int)local_50 * iVar2,&local_5c);
      iVar2 = local_5c;
      sVar4 = fwrite(this->output_buffer_,2,(long)local_5c,local_38);
      if ((int)sVar4 < iVar2) {
        FilterStream();
        local_6c = 0;
      }
      input_stream = (FILE *)local_48;
      this->filter_state_ = 0;
      local_68 = fread(this->input_buffer_,2,local_40,local_48);
    } while ((int)local_68 != 0);
  }
  return local_6c;
}

Assistant:

int FdFilter::FilterStream(FILE *input_stream, FILE *output_stream) {
  int i, j;
  int  toread, towrite, nread, rVal = 1, testc;

  toread = max_input_;
  filter_state_ = 1;  // indicate start of new signal
  /* process data from a stream */
  while ((nread = fread(input_buffer_, sizeof(*input_buffer_), toread,
                        input_stream))) {
    testc = getc(input_stream);
    if (feof(input_stream))
      filter_state_ |= 2;
    else
      ungetc(testc, input_stream);
    if (insert_ > 1) {
      int16_t *p, *q;
      for (p = input_buffer_ + nread - 1,
               q = input_buffer_ + (nread * insert_) - 1, i = nread; i--;) {
        for (j = insert_ - 1; j--;) *q-- = 0;
        *q-- = *p--;
      }
    }
    FilterBuffer(nread*insert_, &towrite);
    if ((i = fwrite(output_buffer_, sizeof(*output_buffer_), towrite,
                    output_stream)) < towrite) {
      fprintf(stderr, "Problems writing output in FilterStream\n");
      rVal = 0;
    }
    filter_state_ = 0;
  }
  return(rVal);
}